

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O2

Instr * __thiscall LowererMD::LoadStackArgPtr(LowererMD *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RegOpnd *pRVar4;
  IndirOpnd *pIVar5;
  Instr *pIVar6;
  Func *func;
  StackSym *sym;
  
  bVar2 = Func::IsLoopBody(this->m_func);
  if (!bVar2) {
    pIVar6 = LowererMDArch::LoadStackArgPtr(&this->lowererMDArch,instr);
    return pIVar6;
  }
  func = this->m_func;
  sym = func->m_loopParamSym;
  if (sym == (StackSym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x23e,"(this->m_func->GetLoopParamSym())","this->m_func->GetLoopParamSym()")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    func = this->m_func;
    sym = func->m_loopParamSym;
  }
  pRVar4 = IR::RegOpnd::New(sym,TyInt64,func);
  pIVar5 = IR::IndirOpnd::New(pRVar4,0x20,TyInt64,this->m_func,false);
  pRVar4 = IR::RegOpnd::New(TyInt64,this->m_func);
  pIVar6 = IR::Instr::New(MOV,&pRVar4->super_Opnd,&pIVar5->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instr,pIVar6);
  pIVar5 = IR::IndirOpnd::New(pRVar4,8,TyInt64,this->m_func,false);
  IR::Instr::SetSrc1(instr,&pIVar5->super_Opnd);
  instr->m_opcode = LEA;
  return instr->m_prev;
}

Assistant:

IR::Instr *
LowererMD::LoadStackArgPtr(IR::Instr * instr)
{
    if (this->m_func->IsLoopBody())
    {
        // Get the first user param from the interpreter frame instance that was passed in.
        // These args don't include the func object and callinfo; we just need to advance past "this".

        // t1 = MOV [prm1 + m_inParams]
        // dst = LEA &[t1 + sizeof(var)]

        Assert(this->m_func->GetLoopParamSym());
        IR::RegOpnd *baseOpnd = IR::RegOpnd::New(this->m_func->GetLoopParamSym(), TyMachReg, this->m_func);
        size_t offset = Js::InterpreterStackFrame::GetOffsetOfInParams();
        IR::IndirOpnd *indirOpnd = IR::IndirOpnd::New(baseOpnd, (int32)offset, TyMachReg, this->m_func);
        IR::RegOpnd *tmpOpnd = IR::RegOpnd::New(TyMachReg, this->m_func);
        IR::Instr *instrLdParams = IR::Instr::New(Js::OpCode::MOV, tmpOpnd, indirOpnd, this->m_func);
        instr->InsertBefore(instrLdParams);

        indirOpnd = IR::IndirOpnd::New(tmpOpnd, sizeof(Js::Var), TyMachReg, this->m_func);
        instr->SetSrc1(indirOpnd);
        instr->m_opcode = Js::OpCode::LEA;

        return instr->m_prev;
    }
    else
    {
        return this->lowererMDArch.LoadStackArgPtr(instr);
    }
}